

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O0

shared_ptr<Face> __thiscall Pyraminx::get_opposite_face(Pyraminx *this,Corner corner)

{
  undefined4 in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 in_register_00000034;
  long lVar2;
  shared_ptr<Face> sVar3;
  Corner corner_local;
  Pyraminx *this_local;
  
  lVar2 = CONCAT44(in_register_00000034,corner);
  switch(in_EDX) {
  case 0:
    std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar2 + 0x48));
    _Var1._M_pi = extraout_RDX;
    break;
  case 1:
    std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar2 + 0x38));
    _Var1._M_pi = extraout_RDX_00;
    break;
  case 2:
    std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar2 + 0x28));
    _Var1._M_pi = extraout_RDX_01;
    break;
  case 3:
    std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar2 + 0x18));
    _Var1._M_pi = extraout_RDX_02;
    break;
  default:
    std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)this,(shared_ptr<Face> *)(lVar2 + 0x18));
    _Var1._M_pi = extraout_RDX_03;
  }
  sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Face>)sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Face> Pyraminx::get_opposite_face(Corner corner){
    switch (corner)
    {
    case Corner::U:
        return green_face;
        break;
    case Corner::L:
        return yellow_face;
        break;
    case Corner::R:
        return red_face;
        break;
    case Corner::B:
        return blue_face;
        break;
    default:
        return blue_face;
        printf("Invalid corner specified.\n");
        break;
    }
}